

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O2

void google::protobuf::compiler::java::anon_unknown_8::SetPrimitiveVariables
               (FieldDescriptor *descriptor,int messageBitIndex,int builderBitIndex,
               FieldGeneratorInfo *info,ClassNameResolver *name_resolver,
               flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables,Context *context)

{
  uint8_t uVar1;
  bool bVar2;
  JavaType type;
  uint32_t x;
  FieldType type_00;
  Type type_01;
  int iVar3;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar4;
  size_t x_00;
  AlphaNum *a;
  int bitIndex;
  int bitIndex_00;
  int bitIndex_01;
  undefined4 in_register_00000014;
  AlphaNum *a_00;
  AlphaNum *a_01;
  AlphaNum *a_02;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  ClassNameResolver *options;
  Options *pOVar5;
  string_view sVar6;
  string_view input;
  undefined1 local_210 [48];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  string name;
  AlphaNum local_190;
  undefined1 local_160 [48];
  string capitalized_type;
  undefined1 local_108 [56];
  Options local_d0;
  Options local_80;
  
  options = name_resolver;
  SetCommonFieldVariables
            (descriptor,(FieldGeneratorInfo *)CONCAT44(in_register_00000014,builderBitIndex),
             (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)name_resolver);
  type = GetJavaType(descriptor);
  local_160._0_16_ = (undefined1  [16])PrimitiveTypeName(type);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_210,(basic_string_view<char,_std::char_traits<char>_> *)local_160,
             (allocator<char> *)&local_190);
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[5],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)name_resolver,(key_arg<char[5]> *)0x61655a);
  std::__cxx11::string::operator=((string *)pbVar4,(string *)local_210);
  std::__cxx11::string::~string((string *)local_210);
  local_160._0_16_ = (undefined1  [16])BoxedPrimitiveTypeName(type);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_210,(basic_string_view<char,_std::char_traits<char>_> *)local_160,
             (allocator<char> *)&local_190);
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)name_resolver,(key_arg<char[11]> *)"boxed_type");
  std::__cxx11::string::operator=((string *)pbVar4,(string *)local_210);
  std::__cxx11::string::~string((string *)local_210);
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[5],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)name_resolver,(key_arg<char[5]> *)0x61655a);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_210,(char (*) [11])0x5532c5,pbVar4);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::
  emplace<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_160,
             (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)name_resolver,
             (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_210);
  std::__cxx11::string::~string((string *)(local_210 + 0x10));
  pOVar5 = (Options *)
           &variables[2].
            super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .
            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .settings_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            size_;
  Options::Options(&local_80,pOVar5);
  ImmutableDefaultValue_abi_cxx11_
            ((string *)local_210,(java *)descriptor,(FieldDescriptor *)info,
             (ClassNameResolver *)&local_80,&options->options_);
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[8],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)name_resolver,(key_arg<char[8]> *)0x57657a);
  std::__cxx11::string::operator=((string *)pbVar4,(string *)local_210);
  std::__cxx11::string::~string((string *)local_210);
  Options::~Options(&local_80);
  Options::Options(&local_d0,pOVar5);
  local_160._0_16_ = (undefined1  [16])GetCapitalizedType(descriptor,true,&local_d0);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_210,(basic_string_view<char,_std::char_traits<char>_> *)local_160,
             (allocator<char> *)&local_190);
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[17],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)name_resolver,(key_arg<char[17]> *)"capitalized_type");
  std::__cxx11::string::operator=((string *)pbVar4,(string *)local_210);
  std::__cxx11::string::~string((string *)local_210);
  Options::~Options(&local_d0);
  x = protobuf::internal::WireFormat::MakeTag(descriptor);
  absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)local_210,x);
  absl::lts_20250127::StrCat_abi_cxx11_((string *)local_160,(lts_20250127 *)local_210,a_00);
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[4],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)name_resolver,(key_arg<char[4]> *)0x4f0e1c);
  std::__cxx11::string::operator=((string *)pbVar4,(string *)local_160);
  std::__cxx11::string::~string((string *)local_160);
  iVar3 = descriptor->number_;
  type_00 = GetType(descriptor);
  x_00 = protobuf::internal::WireFormatLite::TagSize(iVar3,type_00);
  absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)local_210,x_00);
  absl::lts_20250127::StrCat_abi_cxx11_((string *)local_160,(lts_20250127 *)local_210,a_01);
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[9],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)name_resolver,(key_arg<char[9]> *)"tag_size");
  std::__cxx11::string::operator=((string *)pbVar4,(string *)local_160);
  std::__cxx11::string::~string((string *)local_160);
  FieldDescriptor::is_required(descriptor);
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[9],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)name_resolver,(key_arg<char[9]> *)0x65812a);
  std::__cxx11::string::assign((char *)pbVar4);
  sVar6 = PrimitiveTypeName(type);
  input._M_len = sVar6._M_str;
  input._M_str = (char *)0x1;
  UnderscoresToCamelCase_abi_cxx11_(&capitalized_type,(java *)sVar6._M_len,input,SUB81(options,0));
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[5],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)name_resolver,(key_arg<char[5]> *)0x651c1c);
  std::__cxx11::string::string((string *)&name,(string *)pbVar4);
  if (type < JAVATYPE_STRING) {
    local_210._0_16_ =
         (undefined1  [16])absl::lts_20250127::NullSafeStringView("com.google.protobuf.Internal.");
    local_190.piece_ = absl::lts_20250127::NullSafeStringView("List");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_1e0,(lts_20250127 *)local_210,(AlphaNum *)local_160,&local_190,
               (AlphaNum *)options);
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[16],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)name_resolver,(key_arg<char[16]> *)"field_list_type");
    std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    local_210._0_16_ = (undefined1  [16])absl::lts_20250127::NullSafeStringView("empty");
    local_190.piece_ = absl::lts_20250127::NullSafeStringView("List()");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_1e0,(lts_20250127 *)local_210,(AlphaNum *)local_160,&local_190,
               (AlphaNum *)options);
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)name_resolver,(key_arg<char[11]> *)"empty_list");
    std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    local_160._0_16_ = (undefined1  [16])absl::lts_20250127::NullSafeStringView("_.makeImmutable()")
    ;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_190,(lts_20250127 *)local_210,(AlphaNum *)local_160,
               (AlphaNum *)local_160);
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[23],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)name_resolver,(key_arg<char[23]> *)"make_name_unmodifiable");
    std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    local_160._0_16_ = (undefined1  [16])absl::lts_20250127::NullSafeStringView("_.get");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_1e0,(lts_20250127 *)local_210,(AlphaNum *)local_160,&local_190,
               (AlphaNum *)local_160);
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[13],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)name_resolver,(key_arg<char[13]> *)"repeated_get");
    std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    local_160._0_16_ = (undefined1  [16])absl::lts_20250127::NullSafeStringView("_.add");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_1e0,(lts_20250127 *)local_210,(AlphaNum *)local_160,&local_190,
               (AlphaNum *)local_160);
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[13],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)name_resolver,(key_arg<char[13]> *)"repeated_add");
    std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    local_160._0_16_ = (undefined1  [16])absl::lts_20250127::NullSafeStringView("_.set");
    options = (ClassNameResolver *)local_160;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_1e0,(lts_20250127 *)local_210,(AlphaNum *)options,&local_190,
               (AlphaNum *)options);
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[13],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)name_resolver,(key_arg<char[13]> *)"repeated_set");
    std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)name_resolver,(key_arg<char[11]> *)"visit_type");
    std::__cxx11::string::_M_assign((string *)pbVar4);
    local_210._0_16_ = (undefined1  [16])absl::lts_20250127::NullSafeStringView("visit");
    local_160._8_8_ = capitalized_type._M_dataplus._M_p;
    local_160._0_8_ = capitalized_type._M_string_length;
    local_190.piece_ = absl::lts_20250127::NullSafeStringView("List");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_1e0,(lts_20250127 *)local_210,(AlphaNum *)local_160,&local_190,
               (AlphaNum *)options);
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[16],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)name_resolver,(key_arg<char[16]> *)"visit_type_list");
    std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_1e0);
LAB_0029cf4c:
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  else {
    local_160._0_16_ =
         (undefined1  [16])
         absl::lts_20250127::NullSafeStringView("com.google.protobuf.Internal.ProtobufList<");
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)name_resolver,(key_arg<char[11]> *)"boxed_type");
    local_190.piece_._M_str = (pbVar4->_M_dataplus)._M_p;
    local_190.piece_._M_len = pbVar4->_M_string_length;
    local_1e0.first = absl::lts_20250127::NullSafeStringView(">");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_108,(lts_20250127 *)local_160,&local_190,(AlphaNum *)&local_1e0,
               (AlphaNum *)options);
    std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[16],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_210,(char (*) [16])"field_list_type",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::
    emplace<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)(local_108 + 0x20),
               (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)name_resolver,
               (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_210);
    std::__cxx11::string::~string((string *)(local_210 + 0x10));
    std::__cxx11::string::~string((string *)local_108);
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)name_resolver,(key_arg<char[11]> *)"empty_list");
    std::__cxx11::string::assign((char *)pbVar4);
    local_160._0_16_ = (undefined1  [16])absl::lts_20250127::NullSafeStringView("_.makeImmutable()")
    ;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_190,(lts_20250127 *)local_210,(AlphaNum *)local_160,
               (AlphaNum *)local_160);
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[23],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)name_resolver,(key_arg<char[23]> *)"make_name_unmodifiable");
    std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    local_160._0_16_ = (undefined1  [16])absl::lts_20250127::NullSafeStringView("_.get");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_190,(lts_20250127 *)local_210,(AlphaNum *)local_160,
               (AlphaNum *)local_160);
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[13],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)name_resolver,(key_arg<char[13]> *)"repeated_get");
    std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    local_160._0_16_ = (undefined1  [16])absl::lts_20250127::NullSafeStringView("_.add");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_190,(lts_20250127 *)local_210,(AlphaNum *)local_160,
               (AlphaNum *)local_160);
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[13],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)name_resolver,(key_arg<char[13]> *)"repeated_add");
    std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    local_210._8_8_ = name._M_dataplus._M_p;
    local_210._0_8_ = name._M_string_length;
    local_160._0_16_ = (undefined1  [16])absl::lts_20250127::NullSafeStringView("_.set");
    a = (AlphaNum *)local_160;
    absl::lts_20250127::StrCat_abi_cxx11_((string *)&local_190,(lts_20250127 *)local_210,a,a);
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[13],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)name_resolver,(key_arg<char[13]> *)"repeated_set");
    std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)name_resolver,(key_arg<char[11]> *)"visit_type");
    std::__cxx11::string::assign((char *)pbVar4);
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[16],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)name_resolver,(key_arg<char[16]> *)"visit_type_list");
    std::__cxx11::string::assign((char *)pbVar4);
    if (type == JAVATYPE_BYTES) {
      sVar6._M_str = (char *)a;
      sVar6._M_len = (size_t)name._M_dataplus._M_p;
      absl::lts_20250127::AsciiStrToUpper_abi_cxx11_
                ((string *)&local_1e0,(lts_20250127 *)name._M_string_length,sVar6);
      local_210._8_8_ = local_1e0.first._M_len;
      local_210._0_8_ = local_1e0.first._M_str;
      local_160._0_16_ = (undefined1  [16])absl::lts_20250127::NullSafeStringView("_DEFAULT_VALUE");
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)&local_190,(lts_20250127 *)local_210,(AlphaNum *)local_160,
                 (AlphaNum *)local_160);
      pbVar4 = absl::lts_20250127::container_internal::
               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
               ::
               operator[]<char[14],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                         ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                           *)name_resolver,(key_arg<char[14]> *)"bytes_default");
      std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      goto LAB_0029cf4c;
    }
  }
  bVar2 = IsReferenceType(type);
  if (bVar2) {
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)name_resolver,(key_arg<char[11]> *)0x5547b9);
  }
  else {
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)name_resolver,(key_arg<char[11]> *)0x5547b9);
  }
  std::__cxx11::string::assign((char *)pbVar4);
  this = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_210;
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[12],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)name_resolver,(key_arg<char[12]> *)0x56da69);
  std::__cxx11::string::assign((char *)pbVar4);
  type_01 = GetType(descriptor);
  iVar3 = FixedSize(type_01);
  if (iVar3 != -1) {
    absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)this,iVar3);
    absl::lts_20250127::StrCat_abi_cxx11_((string *)local_160,(lts_20250127 *)this,a_02);
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)name_resolver,(key_arg<char[11]> *)"fixed_size");
    std::__cxx11::string::operator=((string *)pbVar4,(string *)local_160);
    std::__cxx11::string::~string((string *)local_160);
  }
  bVar2 = HasHasbit(descriptor);
  if (bVar2) {
    GenerateSetBit_abi_cxx11_((string *)&local_1e0,(java *)(ulong)(uint)messageBitIndex,bitIndex);
    local_210._0_8_ = local_1e0.first._M_str;
    local_210._8_8_ = local_1e0.first._M_len;
    local_160._0_16_ = (undefined1  [16])absl::lts_20250127::NullSafeStringView(";");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_190,(lts_20250127 *)this,(AlphaNum *)local_160,(AlphaNum *)local_160
              );
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[26],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)name_resolver,(key_arg<char[26]> *)"set_has_field_bit_message");
    std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1e0);
    GenerateClearBit_abi_cxx11_
              ((string *)&local_1e0,(java *)(ulong)(uint)messageBitIndex,bitIndex_00);
    local_210._8_8_ = local_1e0.first._M_len;
    local_210._0_8_ = local_1e0.first._M_str;
    local_160._0_16_ = (undefined1  [16])absl::lts_20250127::NullSafeStringView(";");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_190,(lts_20250127 *)this,(AlphaNum *)local_160,(AlphaNum *)local_160
              );
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[28],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)name_resolver,(key_arg<char[28]> *)"clear_has_field_bit_message");
    std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1e0);
    GenerateGetBit_abi_cxx11_((string *)this,(java *)(ulong)(uint)messageBitIndex,bitIndex_01);
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[25],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)name_resolver,(key_arg<char[25]> *)"is_field_present_message");
  }
  else {
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[26],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)name_resolver,(key_arg<char[26]> *)"set_has_field_bit_message");
    std::__cxx11::string::assign((char *)pbVar4);
    pbVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[28],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)name_resolver,(key_arg<char[28]> *)"clear_has_field_bit_message");
    std::__cxx11::string::assign((char *)pbVar4);
    uVar1 = descriptor->type_;
    if (uVar1 == '\x01') {
      local_210._0_16_ =
           (undefined1  [16])
           absl::lts_20250127::NullSafeStringView("java.lang.Double.doubleToRawLongBits(");
      local_160._8_8_ = name._M_dataplus._M_p;
      local_160._0_8_ = name._M_string_length;
      local_190.piece_ = absl::lts_20250127::NullSafeStringView("_) != 0");
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)&local_1e0,(lts_20250127 *)this,(AlphaNum *)local_160,&local_190,
                 (AlphaNum *)options);
      pbVar4 = absl::lts_20250127::container_internal::
               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
               ::
               operator[]<char[25],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                         ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                           *)name_resolver,(key_arg<char[25]> *)"is_field_present_message");
    }
    else if (uVar1 == '\x02') {
      local_210._0_16_ =
           (undefined1  [16])
           absl::lts_20250127::NullSafeStringView("java.lang.Float.floatToRawIntBits(");
      local_160._8_8_ = name._M_dataplus._M_p;
      local_160._0_8_ = name._M_string_length;
      local_190.piece_ = absl::lts_20250127::NullSafeStringView("_) != 0");
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)&local_1e0,(lts_20250127 *)this,(AlphaNum *)local_160,&local_190,
                 (AlphaNum *)options);
      pbVar4 = absl::lts_20250127::container_internal::
               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
               ::
               operator[]<char[25],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                         ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                           *)name_resolver,(key_arg<char[25]> *)"is_field_present_message");
    }
    else {
      if (uVar1 != '\f') {
        local_160._8_8_ = name._M_dataplus._M_p;
        local_160._0_8_ = name._M_string_length;
        local_190.piece_ = absl::lts_20250127::NullSafeStringView("_ != ");
        pbVar4 = absl::lts_20250127::container_internal::
                 raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                 ::
                 operator[]<char[8],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                           ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                             *)name_resolver,(key_arg<char[8]> *)0x57657a);
        local_1e0.first._M_str = (pbVar4->_M_dataplus)._M_p;
        local_1e0.first._M_len = pbVar4->_M_string_length;
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)local_108,(lts_20250127 *)local_160,&local_190,(AlphaNum *)&local_1e0,
                   (AlphaNum *)options);
        std::
        pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<const_char_(&)[25],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (this,(char (*) [25])"is_field_present_message",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::
        emplace<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
                  ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                    *)(local_108 + 0x20),
                   (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)name_resolver,this);
        std::__cxx11::string::~string((string *)(local_210 + 0x10));
        this = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_108;
        goto LAB_0029d31d;
      }
      local_210._0_16_ = (undefined1  [16])absl::lts_20250127::NullSafeStringView("!");
      local_160._8_8_ = name._M_dataplus._M_p;
      local_160._0_8_ = name._M_string_length;
      local_190.piece_ = absl::lts_20250127::NullSafeStringView("_.isEmpty()");
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)&local_1e0,(lts_20250127 *)this,(AlphaNum *)local_160,&local_190,
                 (AlphaNum *)options);
      pbVar4 = absl::lts_20250127::container_internal::
               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
               ::
               operator[]<char[25],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                         ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                           *)name_resolver,(key_arg<char[25]> *)"is_field_present_message");
    }
    this = &local_1e0;
  }
  std::__cxx11::string::operator=((string *)pbVar4,(string *)this);
LAB_0029d31d:
  std::__cxx11::string::~string((string *)this);
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[2],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)name_resolver,(key_arg<char[2]> *)0x489045);
  std::__cxx11::string::assign((char *)pbVar4);
  pbVar4 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[2],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)name_resolver,(key_arg<char[2]> *)0x56e49d);
  std::__cxx11::string::assign((char *)pbVar4);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&capitalized_type);
  return;
}

Assistant:

void SetPrimitiveVariables(
    const FieldDescriptor* descriptor, int messageBitIndex, int builderBitIndex,
    const FieldGeneratorInfo* info, ClassNameResolver* name_resolver,
    absl::flat_hash_map<absl::string_view, std::string>* variables,
    Context* context) {
  SetCommonFieldVariables(descriptor, info, variables);

  (*variables)["empty_list"] =
      "com.google.protobuf.GeneratedMessageLite.emptyProtobufList()";

  (*variables)["default"] =
      ImmutableDefaultValue(descriptor, name_resolver, context->options());
  (*variables)["default_init"] = absl::StrCat(
      "= ",
      ImmutableDefaultValue(descriptor, name_resolver, context->options()));
  (*variables)["capitalized_type"] = "java.lang.String";
  (*variables)["tag"] =
      absl::StrCat(static_cast<int32_t>(WireFormat::MakeTag(descriptor)));
  (*variables)["tag_size"] = absl::StrCat(
      WireFormat::TagSize(descriptor->number(), GetType(descriptor)));

  // TODO: Add @deprecated javadoc when generating javadoc is supported
  // by the proto compiler
  (*variables)["deprecation"] =
      descriptor->options().deprecated() ? "@java.lang.Deprecated " : "";
  (*variables)["required"] = descriptor->is_required() ? "true" : "false";
  if (!context->options().opensource_runtime) {
    (*variables)["enforce_utf8"] = CheckUtf8(descriptor) ? "true" : "false";
  }

  if (HasHasbit(descriptor)) {
    if (!context->options().opensource_runtime) {
      (*variables)["bit_field_id"] = absl::StrCat(messageBitIndex / 32);
      (*variables)["bit_field_name"] = GetBitFieldNameForBit(messageBitIndex);
      (*variables)["bit_field_mask"] =
          absl::StrCat(1 << (messageBitIndex % 32));
    }
    // For singular messages and builders, one bit is used for the hasField bit.
    // Note that these have a trailing ";".
    (*variables)["set_has_field_bit_message"] =
        absl::StrCat(GenerateSetBit(messageBitIndex), ";");
    (*variables)["clear_has_field_bit_message"] =
        absl::StrCat(GenerateClearBit(messageBitIndex), ";");

    (*variables)["is_field_present_message"] = GenerateGetBit(messageBitIndex);
  } else {
    (*variables)["set_has_field_bit_message"] = "";
    (*variables)["clear_has_field_bit_message"] = "";

    variables->insert({"is_field_present_message",
                       absl::StrCat("!", (*variables)["name"], "_.isEmpty()")});
  }

  // Annotations often use { and } variables to denote text ranges.
  (*variables)["{"] = "";
  (*variables)["}"] = "";
}